

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

void __thiscall Cmd::refreshMultiLine(Cmd *this,State *state)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  string ab;
  char seq [64];
  string local_a0;
  size_type local_80;
  char local_78 [72];
  
  local_80 = (this->prompt)._M_string_length;
  lVar6 = (long)(int)local_80;
  uVar5 = state->cols;
  iVar7 = (int)state->maxrows;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  iVar4 = (int)((((state->buf)._M_string_length + uVar5 + lVar6) - 1) / uVar5);
  if (iVar7 < iVar4) {
    state->maxrows = (long)iVar4;
  }
  if ((int)((uVar5 + lVar6 + state->oldpos) / uVar5) < iVar7) {
    snprintf(local_78,0x40,"\x1b[%dB");
    std::__cxx11::string::append((char *)&local_a0);
  }
  if (1 < iVar7) {
    iVar7 = iVar7 + -1;
    do {
      std::__cxx11::string::append((char *)&local_a0);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  std::__cxx11::string::append((char *)&local_a0);
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(this->prompt)._M_dataplus._M_p);
  if (state->mask_mode == true) {
    std::__cxx11::string::_M_replace_aux
              ((ulong)&local_a0,local_a0._M_string_length,0,(char)(state->buf)._M_string_length);
  }
  else {
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(state->buf)._M_dataplus._M_p);
  }
  refreshShowHints(this,&local_a0,state,(int)local_80);
  sVar1 = state->pos;
  if (((sVar1 != 0) && (sVar1 == (state->buf)._M_string_length)) &&
     ((sVar1 + lVar6) % state->cols == 0)) {
    std::__cxx11::string::append((char *)&local_a0);
    iVar7 = iVar4 + 1;
    bVar2 = (int)state->maxrows <= iVar4;
    iVar4 = iVar7;
    if (bVar2) {
      state->maxrows = (long)iVar7;
    }
  }
  uVar3 = state->pos + lVar6;
  uVar5 = state->cols;
  if ((int)((uVar3 + uVar5) / uVar5) < iVar4) {
    snprintf(local_78,0x40,"\x1b[%dA");
    std::__cxx11::string::append((char *)&local_a0);
    uVar5 = state->cols;
    uVar3 = lVar6 + state->pos;
  }
  if ((int)(uVar3 % uVar5) != 0) {
    snprintf(local_78,0x40,"\r\x1b[%dC");
  }
  std::__cxx11::string::append((char *)&local_a0);
  state->oldpos = state->pos;
  write(this->out_fd_,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void refreshMultiLine(State *state) {
		char seq[64];
		const int plen     = prompt.size();
		int rows           = (plen + state->buf.size() + state->cols - 1) / state->cols; // rows used by current buf.
		const int rpos     = (plen + state->oldpos + state->cols) / state->cols;         // cursor relative row.
		const int old_rows = state->maxrows;
		std::string ab;

		// Update maxrows if needed.
		if (rows > static_cast<int>(state->maxrows)) {
			state->maxrows = rows;
		}

		// First step: clear all the lines used before. To do so start by going to the last row.
		if (old_rows - rpos > 0) {
			snprintf(seq, sizeof(seq), "\x1b[%dB", old_rows - rpos);
			ab.append(seq);
		}

		// Now for every row clear it, go up.
		for (int j = 0; j < old_rows - 1; j++) {
			ab.append("\r\x1b[0K\x1b[1A");
		}

		// Clean the top line.
		ab.append("\r\x1b[0K");

		// Write the prompt and the current buffer content
		ab.append(prompt);
		if (state->mask_mode) {
			ab.append(state->buf.size(), '*');
		} else {
			ab.append(state->buf);
		}

		// Show hits if any.
		refreshShowHints(ab, state, plen);

		// If we are at the very end of the screen with our prompt, we need to emit a newline and move the prompt to the first column.
		if (state->pos && state->pos == state->buf.size() && (state->pos + plen) % state->cols == 0) {
			ab.append("\n\r");
			rows++;
			if (rows > static_cast<int>(state->maxrows)) {
				state->maxrows = rows;
			}
		}

		// Move cursor to right position.
		int rpos2 = (plen + state->pos + state->cols) / state->cols; // current cursor relative row.

		// Go up till we reach the expected positon.
		if (rows - rpos2 > 0) {
			snprintf(seq, sizeof(seq), "\x1b[%dA", rows - rpos2);
			ab.append(seq);
		}

		// Set column.
		const int col = (plen + state->pos) % state->cols;
		if (col) {
			snprintf(seq, sizeof(seq), "\r\x1b[%dC", col);
			ab.append(seq);
		} else {
			ab.append("\r");
		}

		state->oldpos = state->pos;

		write_string(ab);
	}